

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_shift_l(mbedtls_mpi *X,size_t count)

{
  size_t sVar1;
  ulong uVar2;
  size_t i;
  int ret;
  size_t count_local;
  mbedtls_mpi *X_local;
  
  sVar1 = mbedtls_mpi_bitlen(X);
  uVar2 = sVar1 + count;
  if ((uVar2 <= (ulong)X->n << 6) ||
     (i._4_4_ = mbedtls_mpi_grow(X,(uVar2 >> 6) + (long)(int)(uint)((uVar2 & 0x3f) != 0)),
     i._4_4_ == 0)) {
    i._4_4_ = 0;
    mbedtls_mpi_core_shift_l(X->p,(ulong)X->n,count);
  }
  return i._4_4_;
}

Assistant:

int mbedtls_mpi_shift_l(mbedtls_mpi *X, size_t count)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i;
    MPI_VALIDATE_RET(X != NULL);

    i = mbedtls_mpi_bitlen(X) + count;

    if (X->n * biL < i) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, BITS_TO_LIMBS(i)));
    }

    ret = 0;

    mbedtls_mpi_core_shift_l(X->p, X->n, count);
cleanup:

    return ret;
}